

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

Iterator<int,_true,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator+=
          (Iterator<int,_true,_std::allocator<unsigned_long>_> *this,difference_type *x)

{
  View<int,_true,_std::allocator<unsigned_long>_> *pVVar1;
  ulong uVar2;
  View<int,_true,_std::allocator<unsigned_long>_> *this_00;
  pointer puVar3;
  ulong uVar4;
  reference piVar5;
  runtime_error *this_01;
  int local_1c;
  
  pVVar1 = this->view_;
  if (pVVar1 == (View<int,_true,_std::allocator<unsigned_long>_> *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Assertion failed.");
LAB_0023536d:
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar2 = (pVVar1->geometry_).size_;
  if (this->index_ < uVar2) {
    uVar4 = this->index_ + *x;
    if (uVar4 < uVar2) {
      this->index_ = uVar4;
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
      if ((pVVar1->geometry_).isSimple_ == true) {
        this->pointer_ = this->pointer_ + *x;
      }
      else {
        piVar5 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                           (this->view_,this->index_);
        this->pointer_ = piVar5;
        View<int,true,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)this->view_,this->index_,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
      }
    }
    else {
      this->index_ = uVar2;
      View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
      this_00 = this->view_;
      if ((pVVar1->geometry_).isSimple_ == true) {
        local_1c = 0;
        piVar5 = marray_detail::AccessOperatorHelper<true>::
                 execute<int,int,true,std::allocator<unsigned_long>>(this_00,&local_1c);
        this->pointer_ = piVar5 + (this->view_->geometry_).size_;
      }
      else {
        piVar5 = View<int,_true,_std::allocator<unsigned_long>_>::operator()
                           (this_00,(this_00->geometry_).size_ - 1);
        this->pointer_ = piVar5 + 1;
        View<int,true,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<int,true,std::allocator<unsigned_long>> *)this->view_,
                   (this->view_->geometry_).size_ - 1,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )(this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start);
        pVVar1 = this->view_;
        View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if ((pVVar1->geometry_).coordinateOrder_ == LastMajorOrder) {
          puVar3 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *puVar3 = *puVar3 + 1;
        }
        else {
          if (this->view_->data_ == (pointer)0x0) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_01,"Assertion failed.");
            goto LAB_0023536d;
          }
          puVar3 = (this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + ((this->view_->geometry_).dimension_ - 1);
          *puVar3 = *puVar3 + 1;
        }
      }
    }
  }
  testInvariant(this);
  return this;
}

Assistant:

inline Iterator<T, isConst, A>&
Iterator<T, isConst, A>::operator+=
(
    const difference_type& x
)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || view_ != 0);
    if(index_ < view_->size()) { // view initialized and iterator not at the end
        if(index_ + x < view_->size()) {
            index_ += x;
            if(view_->isSimple()) {
                pointer_ += x;
            }
            else {
                pointer_ = &((*view_)(index_));
                view_->indexToCoordinates(index_, coordinates_.begin());
            }
        }
        else {
            // set to end iterator
            index_ = view_->size();
            if(view_->isSimple()) {
                pointer_ = &(*view_)(0) + view_->size();
            }
            else {
                pointer_ = (&(*view_)(view_->size()-1)) + 1;
                view_->indexToCoordinates(view_->size()-1, coordinates_.begin());
                if(view_->coordinateOrder() == LastMajorOrder) {
                    ++coordinates_[0];
                }
                else { // FirstMajorOrder
                    ++coordinates_[view_->dimension()-1];
                }
            }
        }
    }
    testInvariant();
    return *this;
}